

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O0

void tcmalloc::SlowTLS::UnregisterEntry(Entry *entry)

{
  long lVar1;
  Entry *next;
  SpinLockHolder h;
  Entry *entry_local;
  
  h.lock_ = (SpinLock *)entry;
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&next,&lock_);
  lVar1 = *(long *)(h.lock_ + 6);
  **(long **)(h.lock_ + 8) = lVar1;
  if (lVar1 != 0) {
    *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)(h.lock_ + 8);
  }
  Entry::DebugDirty((Entry *)h.lock_);
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&next);
  return;
}

Assistant:

static void UnregisterEntry(Entry* entry) {
    SpinLockHolder h(&lock_);
    ASSERT(*entry->prev == entry);
    Entry* next = *entry->prev = entry->next;
    if (next) {
      ASSERT(next->prev == &entry->next);
      next->prev = entry->prev;
    }
    entry->DebugDirty();
  }